

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_get_person_name(void)

{
  int iVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  allocator local_462;
  allocator local_461;
  type result;
  undefined1 local_440 [40];
  int local_418;
  string local_410;
  rpc_client client;
  
  std::__cxx11::string::string((string *)local_440,"127.0.0.1",(allocator *)&result);
  rest_rpc::rpc_client::rpc_client(&client,(string *)local_440,9000);
  std::__cxx11::string::~string((string *)local_440);
  iVar1 = rest_rpc::rpc_client::connect(&client,3,(sockaddr *)0x0,in_ECX);
  if ((char)iVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"connect timeout");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::__cxx11::string::string((string *)&local_410,"get_person_name",&local_461);
    local_440._0_4_ = 1;
    std::__cxx11::string::string((string *)(local_440 + 8),"tom",&local_462);
    local_418 = 0x14;
    rest_rpc::rpc_client::call<5000ul,std::__cxx11::string,person>
              (&result,&client,&local_410,(person *)local_440);
    std::__cxx11::string::~string((string *)(local_440 + 8));
    std::__cxx11::string::~string((string *)&local_410);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&result);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&result);
  }
  rest_rpc::rpc_client::~rpc_client(&client);
  return;
}

Assistant:

void test_get_person_name() {
  try {
    rpc_client client("127.0.0.1", 9000);
    bool r = client.connect();
    if (!r) {
      std::cout << "connect timeout" << std::endl;
      return;
    }

    auto result =
        client.call<std::string>("get_person_name", person{1, "tom", 20});
    std::cout << result << std::endl;
  } catch (const std::exception &e) {
    std::cout << e.what() << std::endl;
  }
}